

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# append.cpp
# Opt level: O3

int main(void)

{
  variant<int,_float,_double> ele;
  variant<int,_float,_double> ele_00;
  int iVar1;
  long *plVar2;
  int i;
  int index;
  heterovector hetvec;
  _Variadic_union<int,_float,_double> _Var3;
  pointer pvVar4;
  
  _Var3 = (_Variadic_union<int,_float,_double>)0x0;
  pvVar4 = (pointer)0x0;
  heterovector::append
            ((heterovector *)&stack0xffffffffffffffc8,(variant<int,_float,_double>)ZEXT816(0));
  ele.super__Variant_base<int,_float,_double>.super__Move_assign_alias<int,_float,_double>.
  super__Copy_assign_alias<int,_float,_double>.super__Move_ctor_alias<int,_float,_double>.
  super__Copy_ctor_alias<int,_float,_double>.super__Variant_storage_alias<int,_float,_double>._8_8_
       = pvVar4;
  ele.super__Variant_base<int,_float,_double>.super__Move_assign_alias<int,_float,_double>.
  super__Copy_assign_alias<int,_float,_double>.super__Move_ctor_alias<int,_float,_double>.
  super__Copy_ctor_alias<int,_float,_double>.super__Variant_storage_alias<int,_float,_double>._M_u =
       _Var3;
  heterovector::append((heterovector *)&stack0xffffffffffffffc8,ele);
  index = 0;
  ele_00.super__Variant_base<int,_float,_double>.super__Move_assign_alias<int,_float,_double>.
  super__Copy_assign_alias<int,_float,_double>.super__Move_ctor_alias<int,_float,_double>.
  super__Copy_ctor_alias<int,_float,_double>.super__Variant_storage_alias<int,_float,_double>._8_8_
       = pvVar4;
  ele_00.super__Variant_base<int,_float,_double>.super__Move_assign_alias<int,_float,_double>.
  super__Copy_assign_alias<int,_float,_double>.super__Move_ctor_alias<int,_float,_double>.
  super__Copy_ctor_alias<int,_float,_double>.super__Variant_storage_alias<int,_float,_double>._M_u =
       _Var3;
  heterovector::append((heterovector *)&stack0xffffffffffffffc8,ele_00);
  do {
    iVar1 = heterovector::get<int>((heterovector *)&stack0xffffffffffffffc8,index);
    plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
    std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
    std::ostream::put((char)plVar2);
    std::ostream::flush();
    index = index + 1;
  } while (index != 3);
  if (_Var3 != (_Variadic_union<int,_float,_double>)0x0) {
    operator_delete((void *)_Var3,-(long)_Var3);
  }
  return 0;
}

Assistant:

int main() {
    heterovector hetvec;

    hetvec.append(3);
    hetvec.append(1);
    hetvec.append(0);

    for (int i = 0; i < 3; i++) {
        std::cout << hetvec.get<int>(i) << std::endl;
    }

    return 0;
}